

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall ON_Surface::IsCylinder(ON_Surface *this,ON_Cylinder *cylinder,double tolerance)

{
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ON_RevSurface *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  ON_Plane *pOVar11;
  ON_Arc *pOVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar18;
  ON_3dPoint local_190;
  undefined1 local_178 [16];
  double local_168;
  undefined8 uStack_160;
  void *local_158;
  uint local_14c;
  long local_148;
  ulong local_140;
  ON_Line line;
  ON_Arc arc;
  ON_Curve *pOVar6;
  
  bVar17 = 0;
  local_178._8_4_ = in_XMM0_Dc;
  local_178._0_8_ = tolerance;
  local_178._12_4_ = in_XMM0_Dd;
  bVar1 = ON_IsValid(tolerance);
  dVar18 = (double)local_178._0_8_;
  uVar15 = local_178._8_8_;
  if (!bVar1) {
    dVar18 = 2.3283064365386963e-10;
    uVar15 = 0;
  }
  dVar18 = (double)((ulong)dVar18 & -(ulong)(0.0 < (double)local_178._0_8_));
  local_178._8_8_ = uVar15 & local_178._8_8_;
  local_178._0_8_ = ~-(ulong)(0.0 < (double)local_178._0_8_) & 0x3df0000000000000 | (ulong)dVar18;
  this_00 = ON_RevSurface::Cast((ON_Object *)this);
  if (this_00 != (ON_RevSurface *)0x0) {
    bVar1 = ON_RevSurface::IsCylindrical(this_00,cylinder,(double)local_178._0_8_);
    return bVar1;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  arc.super_ON_Circle.plane.origin.y = dVar18;
  dVar18 = ON_Interval::Mid((ON_Interval *)&arc);
  iVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar18,0),this,0)
  ;
  pOVar6 = (ON_Curve *)CONCAT44(extraout_var,iVar3);
  if (pOVar6 == (ON_Curve *)0x0) {
    return false;
  }
  pOVar11 = &ON_Plane::World_xy;
  pOVar12 = &arc;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pOVar12->super_ON_Circle).plane.origin.x = (pOVar11->origin).x;
    pOVar11 = (ON_Plane *)((long)pOVar11 + ((ulong)bVar17 * -2 + 1) * 8);
    pOVar12 = (ON_Arc *)((long)pOVar12 + (ulong)bVar17 * -0x10 + 8);
  }
  arc.super_ON_Circle.radius = 1.0;
  arc.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
  arc.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
  ON_Line::ON_Line(&line);
  local_168 = (double)(-(ulong)(2.3283064365386963e-10 < (double)local_178._0_8_) & local_178._0_8_)
  ;
  uStack_160 = 0;
  dVar18 = (double)local_178._0_8_;
  iVar3 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])(pOVar6,0,&arc);
  bVar17 = (byte)iVar3;
  if (bVar17 == 0) {
    iVar3 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                      (local_168._0_4_,pOVar6);
    if ((char)iVar3 == '\0') goto LAB_005ad228;
    ON_Curve::PointAtStart(&local_190,pOVar6);
    line.from.z = local_190.z;
    line.from.x = local_190.x;
    line.from.y = local_190.y;
    ON_Curve::PointAtEnd(&local_190,pOVar6);
    line.to.z = local_190.z;
    line.to.x = local_190.x;
    line.to.y = local_190.y;
    bVar14 = 1;
  }
  else {
LAB_005ad228:
    bVar14 = 0;
  }
  (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar6);
  if ((bVar17 | bVar14) == 1) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_190.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    local_190.y = dVar18;
    dVar18 = ON_Interval::Mid((ON_Interval *)&local_190);
    iVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(dVar18,0),this,1);
    pOVar6 = (ON_Curve *)CONCAT44(extraout_var_00,iVar3);
    if (pOVar6 != (ON_Curve *)0x0) {
      if (bVar17 == 0) {
        iVar3 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                          (local_168._0_4_,pOVar6,0,&arc);
        cVar9 = (char)iVar3;
      }
      else {
        cVar9 = '\x01';
        if (bVar14 == 0) {
          iVar3 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                            (local_168._0_4_,pOVar6);
          if ((char)iVar3 == '\0') {
            bVar14 = 0;
            goto LAB_005ad313;
          }
          ON_Curve::PointAtStart(&local_190,pOVar6);
          line.from.z = local_190.z;
          line.from.x = local_190.x;
          line.from.y = local_190.y;
          ON_Curve::PointAtEnd(&local_190,pOVar6);
          line.to.z = local_190.z;
          line.to.x = local_190.x;
          line.to.y = local_190.y;
        }
        bVar14 = 1;
      }
LAB_005ad313:
      (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar6);
      bVar1 = false;
      if (bVar14 != 0) {
        bVar2 = false;
        if (cVar9 == '\0') goto LAB_005ad41a;
        local_168 = arc.super_ON_Circle.radius;
        p.y = line.from.y;
        p.x = line.from.x;
        p.z = line.from.z;
        ON_Plane::ClosestPointTo(&local_190,(ON_Plane *)&arc,p);
        dVar18 = ON_3dPoint::DistanceTo((ON_3dPoint *)&arc,&local_190);
        if ((double)local_178._0_8_ <= local_168 * 7.450580596925e-09) {
          local_178._0_8_ = local_168 * 7.450580596925e-09;
        }
        if (ABS(arc.super_ON_Circle.radius - dVar18) <= (double)local_178._0_8_) {
          p_00.y = line.to.y;
          p_00.x = line.to.x;
          p_00.z = line.to.z;
          ON_Plane::ClosestPointTo(&local_190,(ON_Plane *)&arc,p_00);
          dVar18 = ON_3dPoint::DistanceTo((ON_3dPoint *)&arc,&local_190);
          if (ABS(arc.super_ON_Circle.radius - dVar18) <= (double)local_178._0_8_) {
            uVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
            uVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
            pvVar7 = onmalloc((long)(int)(uVar4 + 2 + uVar5) << 3);
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,pvVar7);
            lVar8 = (long)(int)uVar4;
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1);
            uVar16 = 0;
            uVar15 = (ulong)uVar5;
            if ((int)uVar5 < 1) {
              uVar15 = uVar16;
            }
            uVar10 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              uVar10 = uVar16;
            }
            local_158 = pvVar7;
            local_148 = lVar8;
            for (; uVar16 != uVar10; uVar16 = uVar16 + 1) {
              uVar4 = (uint)(uVar16 != 0);
              local_140 = uVar16;
              while (uVar4 != 5) {
                local_168 = ((double)(int)(4 - uVar4) * *(double *)((long)local_158 + uVar16 * 8) +
                            (double)(int)uVar4 * *(double *)((long)local_158 + uVar16 * 8 + 8)) *
                            0.25;
                local_14c = uVar4;
                for (uVar13 = 0; uVar13 != uVar15; uVar13 = uVar13 + 1) {
                  uVar4 = (uint)(uVar13 != 0);
                  iVar3 = 4 - (uint)(uVar13 != 0);
                  while (uVar4 != 5) {
                    PointAt(&local_190,this,local_168,
                            ((double)iVar3 * *(double *)((long)pvVar7 + uVar13 * 8 + lVar8 * 8 + 8)
                            + (double)(int)uVar4 *
                              *(double *)((long)pvVar7 + uVar13 * 8 + lVar8 * 8 + 0x10)) * 0.25);
                    p_01.y = local_190.y;
                    p_01.x = local_190.x;
                    p_01.z = local_190.z;
                    ON_Plane::ClosestPointTo(&local_190,(ON_Plane *)&arc,p_01);
                    dVar18 = ON_3dPoint::DistanceTo((ON_3dPoint *)&arc,&local_190);
                    uVar4 = uVar4 + 1;
                    iVar3 = iVar3 + -1;
                    if ((double)local_178._0_8_ < ABS(arc.super_ON_Circle.radius - dVar18)) {
                      onfree(local_158);
                      bVar2 = false;
                      lVar8 = local_148;
                      uVar16 = local_140;
                      goto LAB_005ad672;
                    }
                  }
                  uVar16 = local_140;
                }
                uVar4 = local_14c + 1;
              }
            }
            onfree(local_158);
            lVar8 = local_148;
            if (cylinder == (ON_Cylinder *)0x0) {
              bVar2 = true;
            }
            else {
              ON_Cylinder::Create(cylinder,&arc.super_ON_Circle);
              bVar2 = ON_Cylinder::IsValid(cylinder);
            }
LAB_005ad672:
            bVar1 = lVar8 <= (long)uVar16;
            goto LAB_005ad41a;
          }
        }
      }
    }
  }
  bVar1 = false;
  bVar2 = false;
LAB_005ad41a:
  ON_Line::~ON_Line(&line);
  ON_Plane::~ON_Plane((ON_Plane *)&arc);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool ON_Surface::IsCylinder( ON_Cylinder* cylinder, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  bool rc = rs && rs->IsCylindrical(cylinder,tolerance);

  if ( !rc && !rs )
  {
    ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
    if ( !crv )
      return false;

    ON_Arc arc;
    ON_Line line;
    int bIsLine = 0;
    int bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( !bIsArc )
    {
      bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
      if ( bIsLine )
      {
        line.from = crv->PointAtStart();
        line.to = crv->PointAtEnd();
      }
    }
    delete crv;
    crv = 0;
    if ( !bIsArc && !bIsLine )
      return false;

    crv = IsoCurve(1,Domain(0).Mid());
    if ( !crv )
      return false;
    if ( !bIsArc )
      bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    else if ( !bIsLine )
    {
      bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
      if ( bIsLine )
      {
        line.from = crv->PointAtStart();
        line.to = crv->PointAtEnd();
      }
    }
    delete crv;
    crv = 0;
    if ( !bIsArc || !bIsLine )
      return false;

    double tol = 0.5*ON_SQRT_EPSILON*(arc.radius);
    if ( tol < tolerance )
      tol = tolerance;
    double r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.from));
    if ( fabs(arc.radius - r) > tol )
      return false;
    r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.to));
    if ( fabs(arc.radius - r) > tol )
      return false;

    ON_3dPoint P;
    double u, v;
    int sc0 = SpanCount(0);
    int sc1 = SpanCount(1);
    double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
    double* t = s + (sc0+1);
    GetSpanVector(0,s);
    GetSpanVector(1,t);
    for ( int i = 0; i < sc0; i++ )
    {
      for ( int ii = i?1:0; ii <= 4; ii++ )
      {
        u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
        for ( int j = 0; j < sc1; j++ )
        {
          for ( int jj = j?1:0; jj <= 4; jj++ )
          {
            v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
            P = PointAt(u,v);
            r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(P));
            if ( fabs(arc.radius - r) > tol )
            {
              onfree(s);
              return false;
            }
          }
        }
      }
    }
    onfree(s);


    rc = true;
    if ( cylinder )
    {
      cylinder->Create(arc);
      rc = cylinder->IsValid();
    }
  }

  return rc;
}